

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

vec3 * __thiscall Sphere::intersect(Sphere *this,shared_ptr<Ray> *ray)

{
  double dVar1;
  vec4 right;
  vec4 left;
  vec4 left_00;
  element_type *peVar2;
  vec4 *pvVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  tvec4<float,_(glm::precision)0> left_01;
  vec3 *hitpoint;
  vec3 o;
  vec3 d;
  double t;
  float discriminant;
  float a;
  float c;
  float b;
  float dotOp;
  vec4 op;
  undefined1 local_40 [8];
  vec4 direction;
  vec4 origin;
  shared_ptr<Ray> *ray_local;
  Sphere *this_local;
  
  peVar2 = std::__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ray);
  pvVar3 = Ray::getOrigin(peVar2);
  direction.field_0._8_8_ = *(undefined8 *)&pvVar3->field_0;
  peVar2 = std::__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ray);
  pvVar3 = Ray::getDirection(peVar2);
  local_40 = *(undefined1 (*) [8])&pvVar3->field_0;
  direction.field_0._0_8_ = *(undefined8 *)((long)&pvVar3->field_0 + 8);
  glm::normalize<float,(glm::precision)0,glm::tvec4>((tvec4<float,_(glm::precision)0> *)local_40);
  left_01 = glm::operator-((tvec4<float,_(glm::precision)0> *)((long)&direction.field_0 + 8),
                           &(this->super_Obj).position);
  dVar6 = Obj::dot((vec4)left_01.field_0,(vec4)left_01.field_0);
  left_00.field_0._8_8_ = direction.field_0._0_8_;
  left_00.field_0._0_8_ = local_40;
  dVar7 = Obj::dot(left_00,(vec4)left_01.field_0);
  fVar4 = (float)(dVar7 * 2.0);
  dVar7 = this->radius;
  dVar1 = this->radius;
  left.field_0._8_8_ = direction.field_0._0_8_;
  left.field_0._0_8_ = local_40;
  right.field_0._8_8_ = direction.field_0._0_8_;
  right.field_0._0_8_ = local_40;
  dVar8 = Obj::dot(left,right);
  fVar5 = fVar4 * fVar4 + -((float)dVar8 * 4.0 * (float)(-dVar7 * dVar1 + (double)(float)dVar6));
  if (0.0 <= fVar5) {
    dVar7 = (double)(((fVar4 + fVar5) * -0.5) / (float)dVar8);
    peVar2 = std::__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ray);
    pvVar3 = Ray::getDirection(peVar2);
    glm::tvec3<float,(glm::precision)0>::tvec3<float,(glm::precision)0>
              ((tvec3<float,(glm::precision)0> *)((long)&o.field_0 + 4),pvVar3);
    peVar2 = std::__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Ray,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ray);
    pvVar3 = Ray::getOrigin(peVar2);
    glm::tvec3<float,(glm::precision)0>::tvec3<float,(glm::precision)0>
              ((tvec3<float,(glm::precision)0> *)&hitpoint,pvVar3);
    if (dVar7 <= 0.0) {
      this_local = (Sphere *)0x0;
    }
    else {
      this_local = (Sphere *)operator_new(0xc);
      glm::tvec3<float,(glm::precision)0>::tvec3<double,double,double>
                ((tvec3<float,(glm::precision)0> *)this_local,
                 (double)o.field_0.field_0.y * dVar7 + (double)hitpoint._0_4_,
                 (double)o.field_0.field_0.z * dVar7 + (double)hitpoint._4_4_,
                 (double)d.field_0.field_0.x * dVar7 + (double)o.field_0.field_0.x);
    }
  }
  else {
    this_local = (Sphere *)0x0;
  }
  return (vec3 *)this_local;
}

Assistant:

glm::vec3* Sphere::intersect(std::shared_ptr<Ray> ray) {

    glm::vec4 origin = ray->getOrigin();
    glm::vec4 direction = ray->getDirection();

    glm::normalize(direction);
    glm::vec4 op = origin - position;
    float dotOp = dot(op,op);


    float b = 2.f * (dot(direction, op));
    float c = dotOp - radius * radius;

    float a = dot(direction, direction);

    float discriminant = b * b - 4  *  a * c ;
    if(discriminant < 0){
        return nullptr;
        }

    double t = (-0.5f) * (b + discriminant) / a;

    glm::vec3 d = glm::vec3 (ray->getDirection());
    glm::vec3 o= glm::vec3 (ray->getOrigin());
    if (t > 0.0f) {
        glm::vec3* hitpoint =  new glm::vec3(o.x + d.x * t, o.y + d.y * t, o.z + d.z * t);
        return hitpoint;
    }
    else
    return nullptr;

}